

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O2

int DH_marshal_parameters(CBB *cbb,DH *dh)

{
  int iVar1;
  CBB child;
  
  iVar1 = CBB_add_asn1(cbb,&child,0x20000010);
  if ((((iVar1 != 0) && (iVar1 = marshal_integer(&child,dh->p), iVar1 != 0)) &&
      (iVar1 = marshal_integer(&child,dh->g), iVar1 != 0)) &&
     ((((ulong)dh->priv_length == 0 ||
       (iVar1 = CBB_add_asn1_uint64(&child,(ulong)dh->priv_length), iVar1 != 0)) &&
      (iVar1 = CBB_flush(cbb), iVar1 != 0)))) {
    return 1;
  }
  ERR_put_error(5,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_asn1.cc"
                ,0x5b);
  return 0;
}

Assistant:

int DH_marshal_parameters(CBB *cbb, const DH *dh) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !marshal_integer(&child, dh->p) ||
      !marshal_integer(&child, dh->g) ||
      (dh->priv_length != 0 &&
       !CBB_add_asn1_uint64(&child, dh->priv_length)) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(DH, DH_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}